

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::startRecordingAudio(QSynth *this,QString *fileName)

{
  bool bVar1;
  AudioFileWriter *this_00;
  int __oflag;
  double dVar2;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  QString *fileName_local;
  QSynth *this_local;
  
  synthLocker._8_8_ = fileName;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
  bVar1 = isRecordingAudio(this);
  if ((bVar1) && (this->audioRecorder != (AudioFileWriter *)0x0)) {
    (*this->audioRecorder->_vptr_AudioFileWriter[1])();
  }
  this_00 = (AudioFileWriter *)operator_new(0x48);
  dVar2 = MT32Emu::SampleRateConverter::convertSynthToOutputTimestamp
                    (this->sampleRateConverter,32000.0);
  AudioFileWriter::AudioFileWriter(this_00,(uint)(long)dVar2,(QString *)synthLocker._8_8_);
  this->audioRecorder = this_00;
  AudioFileWriter::open(this->audioRecorder,(char *)0x1,__oflag);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  return;
}

Assistant:

void QSynth::startRecordingAudio(const QString &fileName) {
	QMutexLocker synthLocker(synthMutex);
	if (isRecordingAudio()) delete audioRecorder;
	audioRecorder = new AudioFileWriter(sampleRateConverter->convertSynthToOutputTimestamp(SAMPLE_RATE), fileName);
	audioRecorder->open();
}